

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall Jupiter::File::load(File *this,char *file)

{
  bool bVar1;
  FILE *__stream;
  
  __stream = fopen(file,"rb");
  if (__stream == (FILE *)0x0) {
    bVar1 = false;
  }
  else {
    if ((this->m_data->fileName)._M_string_length == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&this->m_data->fileName,file);
    }
    bVar1 = load(this,(FILE *)__stream);
    fclose(__stream);
  }
  return bVar1;
}

Assistant:

bool Jupiter::File::load(const char *file) {
	FILE *filePtr = fopen(file, "rb");
	if (filePtr == nullptr) {
		return false;
	}

	if (m_data->fileName.empty()) {
		m_data->fileName = file;
	}

	bool result = load(filePtr);
	fclose(filePtr);
	return result;
}